

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O0

bool __thiscall
ON_ObjectRenderingAttributes::IsValid(ON_ObjectRenderingAttributes *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  uint local_48;
  uint local_44;
  int j;
  int i;
  ON_UUID plugin_id;
  ON_MappingRef *mr;
  int count;
  ON_TextLog *text_log_local;
  ON_ObjectRenderingAttributes *this_local;
  
  bVar1 = ON_RenderingAttributes::IsValid(&this->super_ON_RenderingAttributes,text_log);
  if (bVar1) {
    iVar2 = ON_ClassArray<ON_MappingRef>::Count(&this->m_mappings);
    if (1 < iVar2) {
      plugin_id.Data4 = (uchar  [8])ON_ClassArray<ON_MappingRef>::Array(&this->m_mappings);
      for (local_44 = 0; (int)local_44 < iVar2 + -1; local_44 = local_44 + 1) {
        puVar4 = (undefined8 *)((long)plugin_id.Data4 + (long)(int)local_44 * 0x28);
        _j = *puVar4;
        plugin_id._0_8_ = puVar4[1];
        local_48 = local_44;
        while (local_48 = local_48 + 1, (int)local_48 < iVar2) {
          iVar3 = ON_UuidCompare((ON_UUID *)&j,
                                 (ON_UUID *)((long)plugin_id.Data4 + (long)(int)local_48 * 0x28));
          if (iVar3 == 0) {
            if (text_log != (ON_TextLog *)0x0) {
              ON_TextLog::Print(text_log,
                                "ON_ObjectRenderingAttributes error: m_mappings[%d] and m_mappings[%d] have the same plug-in id.\n"
                                ,(ulong)local_44,(ulong)local_48);
            }
            return false;
          }
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_ObjectRenderingAttributes::IsValid( ON_TextLog* text_log ) const
{
  if ( !ON_RenderingAttributes::IsValid(text_log) )
    return false;

  // plug-in uuids must be unique
  int count;
  if( (count = m_mappings.Count()) > 1 )
  {
    const ON_MappingRef* mr = m_mappings.Array();
    ON_UUID plugin_id;
    int i, j;
    for ( i = 0; i < count-1; i++ )
    {
      plugin_id = mr[i].m_plugin_id;
      for ( j = i+1; j < count; j++ )
      {
        if ( !ON_UuidCompare(&plugin_id,&mr[j].m_plugin_id ) )
        {
          if( text_log )
          {
            text_log->Print("ON_ObjectRenderingAttributes error: m_mappings[%d] and m_mappings[%d] have the same plug-in id.\n",i,j);
          }
          return false;
        }
      }
    }
  }

  return true;
}